

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reductors.cpp
# Opt level: O3

void opengv::absolute_pose::modules::gpnp5::groebnerRow21_00000_f
               (Matrix<double,_44,_80,_0,_44,_80> *groebnerMatrix,int targetRow)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  long lVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  
  lVar23 = (long)targetRow;
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar23 + 0x3f4];
  auVar22._8_8_ = 0x8000000000000000;
  auVar22._0_8_ = 0x8000000000000000;
  auVar24 = vxorpd_avx512vl(auVar25,auVar22);
  auVar26._0_8_ =
       auVar24._0_8_ /
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0x409];
  auVar26._8_8_ = auVar24._8_8_;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar23 + 0x3f4] = 0.0;
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0x435];
  auVar24._8_8_ = 0;
  auVar24._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar23 + 0x420];
  auVar24 = vfmadd213sd_fma(auVar27,auVar26,auVar24);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar23 + 0x420] = auVar24._0_8_;
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0x461];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
                 m_storage.m_data.array[lVar23 + 0x44c];
  auVar24 = vfmadd213sd_fma(auVar28,auVar26,auVar1);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar23 + 0x44c] = auVar24._0_8_;
  auVar29._8_8_ = 0;
  auVar29._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0x95d];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
                 m_storage.m_data.array[lVar23 + 0x948];
  auVar24 = vfmadd213sd_fma(auVar29,auVar26,auVar2);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar23 + 0x948] = auVar24._0_8_;
  auVar30._8_8_ = 0;
  auVar30._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0x989];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
                 m_storage.m_data.array[lVar23 + 0x974];
  auVar24 = vfmadd213sd_fma(auVar30,auVar26,auVar3);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar23 + 0x974] = auVar24._0_8_;
  auVar31._8_8_ = 0;
  auVar31._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0x9b5];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
                 m_storage.m_data.array[lVar23 + 0x9a0];
  auVar24 = vfmadd213sd_fma(auVar31,auVar26,auVar4);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar23 + 0x9a0] = auVar24._0_8_;
  auVar32._8_8_ = 0;
  auVar32._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0x9e1];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
                 m_storage.m_data.array[lVar23 + 0x9cc];
  auVar24 = vfmadd213sd_fma(auVar32,auVar26,auVar5);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar23 + 0x9cc] = auVar24._0_8_;
  auVar33._8_8_ = 0;
  auVar33._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xa0d];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
                 m_storage.m_data.array[lVar23 + 0x9f8];
  auVar24 = vfmadd213sd_fma(auVar33,auVar26,auVar6);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar23 + 0x9f8] = auVar24._0_8_;
  auVar34._8_8_ = 0;
  auVar34._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xb41];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
                 m_storage.m_data.array[lVar23 + 0xb2c];
  auVar24 = vfmadd213sd_fma(auVar34,auVar26,auVar7);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar23 + 0xb2c] = auVar24._0_8_;
  auVar35._8_8_ = 0;
  auVar35._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xb6d];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
                 m_storage.m_data.array[lVar23 + 0xb58];
  auVar24 = vfmadd213sd_fma(auVar35,auVar26,auVar8);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar23 + 0xb58] = auVar24._0_8_;
  auVar36._8_8_ = 0;
  auVar36._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xb99];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
                 m_storage.m_data.array[lVar23 + 0xb84];
  auVar24 = vfmadd213sd_fma(auVar36,auVar26,auVar9);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar23 + 0xb84] = auVar24._0_8_;
  auVar37._8_8_ = 0;
  auVar37._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xbc5];
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar23 + 0xbb0];
  auVar24 = vfmadd213sd_fma(auVar37,auVar26,auVar10);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar23 + 0xbb0] = auVar24._0_8_;
  auVar38._8_8_ = 0;
  auVar38._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xbf1];
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar23 + 0xbdc];
  auVar24 = vfmadd213sd_fma(auVar38,auVar26,auVar11);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar23 + 0xbdc] = auVar24._0_8_;
  auVar39._8_8_ = 0;
  auVar39._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xc1d];
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar23 + 0xc08];
  auVar24 = vfmadd213sd_fma(auVar39,auVar26,auVar12);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar23 + 0xc08] = auVar24._0_8_;
  auVar40._8_8_ = 0;
  auVar40._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xc49];
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar23 + 0xc34];
  auVar24 = vfmadd213sd_fma(auVar40,auVar26,auVar13);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar23 + 0xc34] = auVar24._0_8_;
  auVar41._8_8_ = 0;
  auVar41._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xc75];
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar23 + 0xc60];
  auVar24 = vfmadd213sd_fma(auVar41,auVar26,auVar14);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar23 + 0xc60] = auVar24._0_8_;
  auVar42._8_8_ = 0;
  auVar42._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xca1];
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar23 + 0xc8c];
  auVar24 = vfmadd213sd_fma(auVar42,auVar26,auVar15);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar23 + 0xc8c] = auVar24._0_8_;
  auVar43._8_8_ = 0;
  auVar43._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xccd];
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar23 + 0xcb8];
  auVar24 = vfmadd213sd_fma(auVar43,auVar26,auVar16);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar23 + 0xcb8] = auVar24._0_8_;
  auVar44._8_8_ = 0;
  auVar44._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xcf9];
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar23 + 0xce4];
  auVar24 = vfmadd213sd_fma(auVar44,auVar26,auVar17);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar23 + 0xce4] = auVar24._0_8_;
  auVar45._8_8_ = 0;
  auVar45._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xd25];
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar23 + 0xd10];
  auVar24 = vfmadd213sd_fma(auVar45,auVar26,auVar18);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar23 + 0xd10] = auVar24._0_8_;
  auVar46._8_8_ = 0;
  auVar46._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xd51];
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar23 + 0xd3c];
  auVar24 = vfmadd213sd_fma(auVar46,auVar26,auVar19);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar23 + 0xd3c] = auVar24._0_8_;
  auVar47._8_8_ = 0;
  auVar47._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xd7d];
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar23 + 0xd68];
  auVar24 = vfmadd213sd_fma(auVar47,auVar26,auVar20);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar23 + 0xd68] = auVar24._0_8_;
  auVar48._8_8_ = 0;
  auVar48._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xda9];
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar23 + 0xd94];
  auVar24 = vfmadd213sd_fma(auVar48,auVar26,auVar21);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar23 + 0xd94] = auVar24._0_8_;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp5::groebnerRow21_00000_f( Eigen::Matrix<double,44,80> & groebnerMatrix, int targetRow )
{
  double factor = groebnerMatrix(targetRow,23) / groebnerMatrix(21,23);
  groebnerMatrix(targetRow,23) = 0.0;
  groebnerMatrix(targetRow,24) -= factor * groebnerMatrix(21,24);
  groebnerMatrix(targetRow,25) -= factor * groebnerMatrix(21,25);
  groebnerMatrix(targetRow,54) -= factor * groebnerMatrix(21,54);
  groebnerMatrix(targetRow,55) -= factor * groebnerMatrix(21,55);
  groebnerMatrix(targetRow,56) -= factor * groebnerMatrix(21,56);
  groebnerMatrix(targetRow,57) -= factor * groebnerMatrix(21,57);
  groebnerMatrix(targetRow,58) -= factor * groebnerMatrix(21,58);
  groebnerMatrix(targetRow,65) -= factor * groebnerMatrix(21,65);
  groebnerMatrix(targetRow,66) -= factor * groebnerMatrix(21,66);
  groebnerMatrix(targetRow,67) -= factor * groebnerMatrix(21,67);
  groebnerMatrix(targetRow,68) -= factor * groebnerMatrix(21,68);
  groebnerMatrix(targetRow,69) -= factor * groebnerMatrix(21,69);
  groebnerMatrix(targetRow,70) -= factor * groebnerMatrix(21,70);
  groebnerMatrix(targetRow,71) -= factor * groebnerMatrix(21,71);
  groebnerMatrix(targetRow,72) -= factor * groebnerMatrix(21,72);
  groebnerMatrix(targetRow,73) -= factor * groebnerMatrix(21,73);
  groebnerMatrix(targetRow,74) -= factor * groebnerMatrix(21,74);
  groebnerMatrix(targetRow,75) -= factor * groebnerMatrix(21,75);
  groebnerMatrix(targetRow,76) -= factor * groebnerMatrix(21,76);
  groebnerMatrix(targetRow,77) -= factor * groebnerMatrix(21,77);
  groebnerMatrix(targetRow,78) -= factor * groebnerMatrix(21,78);
  groebnerMatrix(targetRow,79) -= factor * groebnerMatrix(21,79);
}